

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,
          vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *v,bool show_full_path)

{
  ulong uVar1;
  size_type sVar2;
  const_reference this_00;
  string local_1d0;
  ulong local_1b0;
  size_t i;
  stringstream ss;
  ostream aoStack_198 [383];
  byte local_19;
  tinyusdz *ptStack_18;
  bool show_full_path_local;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *v_local;
  
  local_19 = (byte)v & 1;
  ptStack_18 = this;
  v_local = (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&i);
  std::operator<<(aoStack_198,"[");
  local_1b0 = 0;
  while( true ) {
    uVar1 = local_1b0;
    sVar2 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)ptStack_18);
    if (sVar2 <= uVar1) break;
    this_00 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[]
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)ptStack_18,
                         local_1b0);
    to_string_abi_cxx11_
              (&local_1d0,(tinyusdz *)this_00,(Path *)(ulong)(local_19 & 1),SUB81(sVar2,0));
    std::operator<<(aoStack_198,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    uVar1 = local_1b0;
    sVar2 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)ptStack_18);
    if (uVar1 != sVar2 - 1) {
      std::operator<<(aoStack_198,", ");
    }
    local_1b0 = local_1b0 + 1;
  }
  std::operator<<(aoStack_198,"]");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&i);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const std::vector<Path> &v, bool show_full_path) {
  // TODO(syoyo): indent
  std::stringstream ss;
  ss << "[";

  for (size_t i = 0; i < v.size(); i++) {
    ss << to_string(v[i], show_full_path);
    if (i != (v.size() - 1)) {
      ss << ", ";
    }
  }
  ss << "]";
  return ss.str();
}